

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_CodeLocation.cpp
# Opt level: O0

string * __thiscall
soul::CodeLocation::getSourceLine_abi_cxx11_(string *__return_storage_ptr__,CodeLocation *this)

{
  char *pcVar1;
  char *__end;
  allocator<char> local_45 [13];
  undefined1 local_38 [8];
  CodeLocation e;
  CodeLocation s;
  CodeLocation *this_local;
  
  s.location.data = (char *)this;
  pcVar1 = UTF8Reader::getAddress(&this->location);
  if (pcVar1 == (char *)0x0) {
    std::__cxx11::string::string((string *)__return_storage_ptr__);
  }
  else {
    getStartOfLine((CodeLocation *)&e.location);
    getEndOfLine((CodeLocation *)local_38);
    pcVar1 = UTF8Reader::getAddress((UTF8Reader *)&s);
    __end = UTF8Reader::getAddress((UTF8Reader *)&e);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<char_const*,void>
              ((string *)__return_storage_ptr__,pcVar1,__end,local_45);
    std::allocator<char>::~allocator(local_45);
    ~CodeLocation((CodeLocation *)local_38);
    ~CodeLocation((CodeLocation *)&e.location);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string CodeLocation::getSourceLine() const
{
    if (location.getAddress() == nullptr)
        return {};

    auto s = getStartOfLine();
    auto e = getEndOfLine();

    return { s.location.getAddress(),
             e.location.getAddress() };
}